

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_sse4.c
# Opt level: O3

int av1_selfguided_restoration_sse4_1
              (uint8_t *dgd8,int width,int height,int dgd_stride,int32_t *flt0,int32_t *flt1,
              int flt_stride,int sgr_params_idx,int bit_depth,int highbd)

{
  void *__s;
  int *piVar1;
  int32_t *piVar2;
  size_t __n;
  uint uVar3;
  undefined8 *puVar4;
  int *piVar5;
  int *piVar6;
  int *piVar7;
  uint *puVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  void *__s_00;
  long lVar31;
  byte bVar32;
  void *pvVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  ulong uVar37;
  undefined1 (*pauVar38) [16];
  long lVar39;
  uint8_t *puVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  uint uVar45;
  long lVar46;
  long lVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  __m128i fives_plus_sixes_1;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  __m128i rounding_a;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  int iVar59;
  int iVar60;
  undefined1 in_XMM4 [16];
  __m128i rounding_b;
  undefined1 auVar61 [16];
  int iVar63;
  ulong uVar62;
  __m128i shift_a;
  int iVar64;
  int iVar65;
  int iVar66;
  __m128i shift_b;
  int iVar67;
  int iVar68;
  undefined1 auVar69 [16];
  undefined1 in_XMM8 [16];
  undefined1 in_XMM9 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  int iVar73;
  uint uVar85;
  uint uVar86;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar87;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  uint uVar74;
  uint uVar88;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  int iVar75;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  uint uVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  __m128i mask [4];
  int32_t *local_98;
  int32_t *local_80;
  undefined1 local_78 [72];
  
  __s_00 = aom_memalign(0x10,0x1fa40);
  if (__s_00 == (void *)0x0) {
    iVar30 = -1;
  }
  else {
    memset(__s_00,0,0x1fa40);
    iVar30 = (width + 9U & 0xfffffffc) + 0x10;
    pvVar33 = (void *)((long)__s_00 + 0xfd2c);
    __s = (void *)((long)__s_00 + 0x17bbc);
    lVar31 = (long)iVar30;
    puVar40 = dgd8 + (dgd_stride * -3 + -3);
    lVar44 = (long)width;
    __n = lVar44 * 4 + 0x1c;
    if (highbd == 0) {
      memset(pvVar33,0,__n);
      memset(__s,0,__n);
      if (-6 < height) {
        lVar41 = (long)__s_00 + lVar31 * 4 + 0x17bc0;
        lVar34 = (long)__s_00 + 0x17bc0;
        uVar37 = 0;
        do {
          uVar37 = uVar37 + 1;
          *(undefined4 *)((long)__s + uVar37 * lVar31 * 4) = 0;
          *(undefined4 *)((long)pvVar33 + uVar37 * lVar31 * 4) = 0;
          if (-6 < width) {
            iVar65 = 0;
            lVar35 = 0;
            iVar68 = 0;
            do {
              piVar1 = (int *)(lVar34 + lVar35 * 4);
              iVar75 = piVar1[1];
              iVar73 = piVar1[2];
              iVar87 = piVar1[3];
              piVar5 = (int *)(lVar34 + -0x7e90 + lVar35 * 4);
              iVar16 = *piVar5;
              iVar18 = piVar5[1];
              iVar19 = piVar5[2];
              iVar20 = piVar5[3];
              auVar61 = pmovzxbd(in_XMM4,*(undefined4 *)(puVar40 + lVar35));
              iVar59 = auVar61._0_4_;
              iVar63 = iVar59 + auVar61._4_4_;
              in_XMM4 = pmaddwd(auVar61,auVar61);
              iVar60 = in_XMM4._0_4_;
              iVar66 = iVar60 + in_XMM4._4_4_;
              iVar64 = iVar63 + iVar65 + iVar87 + auVar61._8_4_ + auVar61._12_4_;
              iVar67 = iVar66 + iVar68 + iVar20 + in_XMM4._8_4_ + in_XMM4._12_4_;
              piVar5 = (int *)(lVar41 + lVar35 * 4);
              *piVar5 = iVar65 + *piVar1 + iVar59;
              piVar5[1] = iVar65 + iVar75 + iVar63;
              piVar5[2] = iVar59 + iVar65 + iVar73 + auVar61._4_4_ + auVar61._8_4_;
              piVar5[3] = iVar64;
              piVar1 = (int *)(lVar41 + -0x7e90 + lVar35 * 4);
              *piVar1 = iVar68 + iVar16 + iVar60;
              piVar1[1] = iVar68 + iVar18 + iVar66;
              piVar1[2] = iVar60 + iVar68 + iVar19 + in_XMM4._4_4_ + in_XMM4._8_4_;
              piVar1[3] = iVar67;
              iVar65 = iVar64 - iVar87;
              iVar68 = iVar67 - iVar20;
              lVar35 = lVar35 + 4;
            } while (lVar35 < width + 6);
          }
          puVar40 = puVar40 + dgd_stride;
          lVar41 = lVar41 + lVar31 * 4;
          lVar34 = lVar34 + lVar31 * 4;
        } while (uVar37 != height + 6U);
      }
    }
    else {
      memset(pvVar33,0,__n);
      memset(__s,0,__n);
      if (-6 < height) {
        lVar41 = (long)puVar40 * 2;
        lVar34 = (long)__s_00 + lVar31 * 4 + 0x17bc0;
        lVar35 = (long)__s_00 + 0x17bc0;
        uVar37 = 0;
        do {
          uVar37 = uVar37 + 1;
          *(undefined4 *)((long)__s + uVar37 * lVar31 * 4) = 0;
          *(undefined4 *)((long)pvVar33 + uVar37 * lVar31 * 4) = 0;
          if (-6 < width) {
            iVar65 = 0;
            lVar39 = 0;
            iVar68 = 0;
            do {
              piVar1 = (int *)(lVar35 + lVar39 * 4);
              iVar75 = piVar1[1];
              iVar73 = piVar1[2];
              iVar87 = piVar1[3];
              piVar5 = (int *)(lVar35 + -0x7e90 + lVar39 * 4);
              iVar16 = *piVar5;
              iVar18 = piVar5[1];
              iVar19 = piVar5[2];
              iVar20 = piVar5[3];
              auVar61 = pmovzxwd(in_XMM4,*(undefined8 *)(lVar41 + lVar39 * 2));
              iVar59 = auVar61._0_4_;
              iVar63 = iVar59 + auVar61._4_4_;
              in_XMM4 = pmaddwd(auVar61,auVar61);
              iVar60 = in_XMM4._0_4_;
              iVar66 = iVar60 + in_XMM4._4_4_;
              iVar64 = iVar63 + iVar65 + iVar87 + auVar61._8_4_ + auVar61._12_4_;
              iVar67 = iVar66 + iVar68 + iVar20 + in_XMM4._8_4_ + in_XMM4._12_4_;
              piVar5 = (int *)(lVar34 + lVar39 * 4);
              *piVar5 = iVar65 + *piVar1 + iVar59;
              piVar5[1] = iVar65 + iVar75 + iVar63;
              piVar5[2] = iVar59 + iVar65 + iVar73 + auVar61._4_4_ + auVar61._8_4_;
              piVar5[3] = iVar64;
              piVar1 = (int *)(lVar34 + -0x7e90 + lVar39 * 4);
              *piVar1 = iVar68 + iVar16 + iVar60;
              piVar1[1] = iVar68 + iVar18 + iVar66;
              piVar1[2] = iVar60 + iVar68 + iVar19 + in_XMM4._4_4_ + in_XMM4._8_4_;
              piVar1[3] = iVar67;
              iVar65 = iVar64 - iVar87;
              iVar68 = iVar67 - iVar20;
              lVar39 = lVar39 + 4;
            } while (lVar39 < width + 6);
          }
          lVar41 = lVar41 + (long)dgd_stride * 2;
          lVar34 = lVar34 + lVar31 * 4;
          lVar35 = lVar35 + lVar31 * 4;
        } while (uVar37 != height + 6U);
      }
    }
    lVar41 = (long)sgr_params_idx;
    uVar14 = av1_sgr_params[lVar41].r[0];
    bVar32 = (byte)highbd;
    if (0 < (int)uVar14) {
      iVar65 = uVar14 * 2 + 1;
      iVar65 = iVar65 * iVar65;
      iVar68 = av1_sgr_params[lVar41].s[0];
      uVar15 = av1_one_by_x[iVar65 - 1];
      uVar37 = 0x20;
      pauVar38 = (undefined1 (*) [16])local_78;
      do {
        auVar61._8_4_ = 0xffffffff;
        auVar61._0_8_ = 0xffffffffffffffff;
        auVar61._12_4_ = 0xffffffff;
        auVar91._0_8_ = 0xffffffffffffffff >> (uVar37 & 0xffffffff);
        auVar91._8_8_ = auVar61._8_8_ >> (uVar37 & 0xffffffff);
        auVar61 = pmovsxbd(ZEXT416((uint)uVar37),auVar91);
        *pauVar38 = auVar61;
        pauVar38 = pauVar38 + 1;
        uVar37 = uVar37 - 8;
      } while (uVar37 != 0);
      if (-2 < height) {
        auVar57._4_4_ = iVar68;
        auVar57._0_4_ = iVar68;
        auVar57._8_4_ = iVar68;
        auVar57._12_4_ = iVar68;
        lVar42 = (long)(int)((uVar14 + 1) * iVar30);
        auVar70._4_4_ = iVar65;
        auVar70._0_4_ = iVar65;
        auVar70._8_4_ = iVar65;
        auVar70._12_4_ = iVar65;
        uVar3 = bit_depth * 2 - 0x10;
        uVar45 = 1 << ((byte)uVar3 & 0x1f);
        auVar94._0_4_ = uVar45 >> 1;
        auVar94._4_4_ = uVar45 >> 1;
        auVar94._8_4_ = uVar45 >> 1;
        auVar94._12_4_ = uVar45 >> 1;
        iVar68 = (1 << ((byte)(bit_depth - 8U) & 0x1f)) >> 1;
        auVar82._4_4_ = uVar15;
        auVar82._0_4_ = uVar15;
        auVar82._8_4_ = uVar15;
        auVar82._12_4_ = uVar15;
        lVar46 = (long)(iVar30 * 3);
        pvVar33 = (void *)((long)__s_00 + lVar46 * 4);
        lVar35 = lVar31 * 8;
        lVar34 = lVar46 * 4 + (long)(int)(uVar14 * iVar30) * 4;
        lVar39 = (long)__s_00 + lVar34 + (ulong)uVar14 * 4 + 0xfd38;
        lVar47 = (long)__s_00 + (ulong)uVar14 * 4 + lVar46 * 4 + lVar42 * -4 + 0xfd38;
        lVar34 = (long)__s_00 + lVar34 + (long)(int)~uVar14 * 4 + 0xfd38;
        lVar42 = (long)__s_00 + lVar46 * 4 + (long)(int)~uVar14 * 4 + lVar42 * -4 + 0xfd38;
        lVar43 = -1;
        in_XMM8 = pmovsxbw(in_XMM8,0x800080008000800);
        in_XMM9 = pmovzxbd(in_XMM9,0xffffffff);
        auVar61 = pmovsxwd(ZEXT416(uVar15),0x100010001000100);
        in_XMM10 = pmovsxwd(in_XMM10,0x800080008000800);
        do {
          if (-2 < width) {
            lVar36 = -1;
            iVar65 = width + 2;
            do {
              piVar1 = (int *)(lVar42 + 0x7e94 + lVar36 * 4);
              piVar5 = (int *)(lVar47 + 0x7e94 + lVar36 * 4);
              piVar6 = (int *)(lVar34 + 0x7e94 + lVar36 * 4);
              piVar7 = (int *)(lVar39 + 0x7e94 + lVar36 * 4);
              auVar71._0_4_ = *piVar7 + (*piVar1 - (*piVar6 + *piVar5));
              auVar71._4_4_ = piVar7[1] + (piVar1[1] - (piVar6[1] + piVar5[1]));
              auVar71._8_4_ = piVar7[2] + (piVar1[2] - (piVar6[2] + piVar5[2]));
              auVar71._12_4_ = piVar7[3] + (piVar1[3] - (piVar6[3] + piVar5[3]));
              piVar1 = (int *)(lVar42 + 4 + lVar36 * 4);
              piVar5 = (int *)(lVar47 + 4 + lVar36 * 4);
              piVar6 = (int *)(lVar34 + 4 + lVar36 * 4);
              piVar7 = (int *)(lVar39 + 4 + lVar36 * 4);
              auVar76._0_4_ = *piVar7 + (*piVar1 - (*piVar6 + *piVar5));
              auVar76._4_4_ = piVar7[1] + (piVar1[1] - (piVar6[1] + piVar5[1]));
              auVar76._8_4_ = piVar7[2] + (piVar1[2] - (piVar6[2] + piVar5[2]));
              auVar76._12_4_ = piVar7[3] + (piVar1[3] - (piVar6[3] + piVar5[3]));
              if (iVar65 < 4) {
                auVar71 = auVar71 & *(undefined1 (*) [16])(local_78 + (long)iVar65 * 0x10);
                auVar76 = auVar76 & *(undefined1 (*) [16])(local_78 + (long)iVar65 * 0x10);
              }
              if (bit_depth < 9) {
                auVar91 = pmaddwd(auVar71,auVar71);
                auVar78 = pmulld(auVar76,auVar70);
              }
              else {
                uVar37 = (ulong)uVar3;
                auVar77._0_4_ = auVar76._0_4_ + auVar94._0_4_ >> uVar37;
                auVar77._4_4_ = auVar76._4_4_ + auVar94._4_4_ >> uVar37;
                auVar77._8_4_ = auVar76._8_4_ + auVar94._8_4_ >> uVar37;
                auVar77._12_4_ = auVar76._12_4_ + auVar94._12_4_ >> uVar37;
                uVar37 = (ulong)(bit_depth - 8U);
                auVar90._0_4_ = (uint)(auVar71._0_4_ + iVar68) >> uVar37;
                auVar90._4_4_ = (uint)(auVar71._4_4_ + iVar68) >> uVar37;
                auVar90._8_4_ = (uint)(auVar71._8_4_ + iVar68) >> uVar37;
                auVar90._12_4_ = (uint)(auVar71._12_4_ + iVar68) >> uVar37;
                auVar91 = pmaddwd(auVar90,auVar90);
                auVar76 = pmulld(auVar77,auVar70);
                iVar75 = auVar91._0_4_;
                iVar73 = auVar76._0_4_;
                auVar78._0_4_ = (uint)(iVar73 < iVar75) * iVar75 | (uint)(iVar73 >= iVar75) * iVar73
                ;
                iVar75 = auVar91._4_4_;
                iVar73 = auVar76._4_4_;
                auVar78._4_4_ = (uint)(iVar73 < iVar75) * iVar75 | (uint)(iVar73 >= iVar75) * iVar73
                ;
                iVar75 = auVar91._8_4_;
                iVar73 = auVar76._8_4_;
                iVar87 = auVar76._12_4_;
                auVar78._8_4_ = (uint)(iVar73 < iVar75) * iVar75 | (uint)(iVar73 >= iVar75) * iVar73
                ;
                iVar75 = auVar91._12_4_;
                auVar78._12_4_ =
                     (uint)(iVar87 < iVar75) * iVar75 | (uint)(iVar87 >= iVar75) * iVar87;
              }
              auVar79._0_4_ = auVar78._0_4_ - auVar91._0_4_;
              auVar79._4_4_ = auVar78._4_4_ - auVar91._4_4_;
              auVar79._8_4_ = auVar78._8_4_ - auVar91._8_4_;
              auVar79._12_4_ = auVar78._12_4_ - auVar91._12_4_;
              auVar91 = pmulld(auVar79,auVar57);
              uVar74 = (uint)(auVar91._0_4_ + in_XMM8._0_4_) >> 0x14;
              uVar85 = (uint)(auVar91._4_4_ + in_XMM8._4_4_) >> 0x14;
              uVar86 = (uint)(auVar91._8_4_ + in_XMM8._8_4_) >> 0x14;
              uVar88 = (uint)(auVar91._12_4_ + in_XMM8._12_4_) >> 0x14;
              uVar14 = in_XMM9._0_4_;
              uVar15 = in_XMM9._4_4_;
              uVar45 = in_XMM9._8_4_;
              uVar17 = in_XMM9._12_4_;
              iVar75 = av1_x_by_xplus1[(uVar14 < uVar74) * uVar14 | (uVar14 >= uVar74) * uVar74];
              iVar73 = av1_x_by_xplus1[(uVar15 < uVar85) * uVar15 | (uVar15 >= uVar85) * uVar85];
              iVar87 = av1_x_by_xplus1[(uVar45 < uVar86) * uVar45 | (uVar45 >= uVar86) * uVar86];
              iVar16 = av1_x_by_xplus1[(uVar17 < uVar88) * uVar17 | (uVar17 >= uVar88) * uVar88];
              puVar4 = (undefined8 *)((long)pvVar33 + lVar36 * 4 + 0x1c);
              *puVar4 = CONCAT44(iVar73,iVar75);
              puVar4[1] = CONCAT44(iVar16,iVar87);
              auVar92._0_4_ = auVar61._0_4_ - iVar75;
              auVar92._4_4_ = auVar61._4_4_ - iVar73;
              auVar92._8_4_ = auVar61._8_4_ - iVar87;
              auVar92._12_4_ = auVar61._12_4_ - iVar16;
              auVar91 = pmaddwd(auVar92,auVar82);
              auVar91 = pmulld(auVar91,auVar71);
              puVar8 = (uint *)((long)pvVar33 + lVar36 * 4 + 0x7eac);
              *puVar8 = (uint)(auVar91._0_4_ + in_XMM10._0_4_) >> 0xc;
              puVar8[1] = (uint)(auVar91._4_4_ + in_XMM10._4_4_) >> 0xc;
              puVar8[2] = (uint)(auVar91._8_4_ + in_XMM10._8_4_) >> 0xc;
              puVar8[3] = (uint)(auVar91._12_4_ + in_XMM10._12_4_) >> 0xc;
              lVar36 = lVar36 + 4;
              iVar65 = iVar65 + -4;
            } while (lVar36 <= lVar44);
          }
          lVar43 = lVar43 + 2;
          pvVar33 = (void *)((long)pvVar33 + lVar35);
          lVar39 = lVar39 + lVar35;
          lVar47 = lVar47 + lVar35;
          lVar34 = lVar34 + lVar35;
          lVar42 = lVar42 + lVar35;
        } while (lVar43 <= height);
        puVar40 = (uint8_t *)((long)dgd8 * 2);
        if (highbd == 0) {
          puVar40 = dgd8;
        }
        if (0 < height) {
          lVar34 = lVar31 * 4;
          lVar39 = (long)__s_00 + lVar31 * 4 + lVar46 * 4 + 0x7eb0;
          lVar42 = (long)__s_00 + lVar31 * 8 + lVar46 * 4 + 0x7eb0;
          lVar35 = (long)__s_00 + lVar46 * 4 + 0x7eb0;
          iVar68 = 0;
          auVar91 = pmovzxbd(auVar57,0x80808080);
          uVar37 = 0;
          local_98 = flt0;
          do {
            if ((uVar37 & 1) == 0) {
              if (0 < width) {
                lVar43 = 0;
                do {
                  auVar53._8_8_ = 0;
                  auVar53._0_8_ = *(ulong *)(puVar40 + (iVar68 + (int)lVar43 << (bVar32 & 0x1f)));
                  if (highbd == 0) {
                    auVar57 = pmovzxbd(auVar94,auVar53);
                  }
                  else {
                    auVar57 = pmovzxwd(auVar94,auVar53);
                  }
                  piVar1 = (int *)(lVar35 + -0x7e98 + lVar43 * 4);
                  piVar5 = (int *)(lVar35 + -0x7e94 + lVar43 * 4);
                  piVar6 = (int *)(lVar35 + -0x7e90 + lVar43 * 4);
                  piVar7 = (int *)(lVar42 + -0x7e98 + lVar43 * 4);
                  piVar9 = (int *)(lVar42 + -0x7e94 + lVar43 * 4);
                  piVar10 = (int *)(lVar42 + -0x7e90 + lVar43 * 4);
                  auVar54._4_4_ =
                       (piVar10[1] + piVar7[1] + piVar6[1] + piVar1[1]) * 5 +
                       (piVar9[1] + piVar5[1]) * 6;
                  auVar54._0_4_ =
                       (*piVar10 + *piVar7 + *piVar6 + *piVar1) * 5 + (*piVar9 + *piVar5) * 6;
                  auVar54._8_4_ =
                       (piVar10[2] + piVar7[2] + piVar6[2] + piVar1[2]) * 5 +
                       (piVar9[2] + piVar5[2]) * 6;
                  auVar54._12_4_ =
                       (piVar10[3] + piVar7[3] + piVar6[3] + piVar1[3]) * 5 +
                       (piVar9[3] + piVar5[3]) * 6;
                  auVar57 = pmaddwd(auVar54,auVar57);
                  piVar6 = (int *)(lVar35 + -8 + lVar43 * 4);
                  piVar7 = (int *)(lVar35 + -4 + lVar43 * 4);
                  piVar1 = (int *)(lVar35 + lVar43 * 4);
                  piVar9 = (int *)(lVar42 + -8 + lVar43 * 4);
                  piVar10 = (int *)(lVar42 + -4 + lVar43 * 4);
                  piVar5 = (int *)(lVar42 + lVar43 * 4);
                  auVar94._0_4_ =
                       (*piVar5 + *piVar9 + *piVar1 + *piVar6) * 5 + (*piVar10 + *piVar7) * 6 +
                       auVar57._0_4_ + auVar61._0_4_ >> 9;
                  auVar94._4_4_ =
                       (piVar5[1] + piVar9[1] + piVar1[1] + piVar6[1]) * 5 +
                       (piVar10[1] + piVar7[1]) * 6 + auVar57._4_4_ + auVar61._4_4_ >> 9;
                  auVar94._8_4_ =
                       (piVar5[2] + piVar9[2] + piVar1[2] + piVar6[2]) * 5 +
                       (piVar10[2] + piVar7[2]) * 6 + auVar57._8_4_ + auVar61._8_4_ >> 9;
                  auVar94._12_4_ =
                       (piVar5[3] + piVar9[3] + piVar1[3] + piVar6[3]) * 5 +
                       (piVar10[3] + piVar7[3]) * 6 + auVar57._12_4_ + auVar61._12_4_ >> 9;
                  *(undefined1 (*) [16])(local_98 + lVar43) = auVar94;
                  lVar43 = lVar43 + 4;
                } while (lVar43 < lVar44);
              }
            }
            else if (0 < width) {
              lVar43 = 0;
              do {
                auVar55._8_8_ = 0;
                auVar55._0_8_ = *(ulong *)(puVar40 + (iVar68 + (int)lVar43 << (bVar32 & 0x1f)));
                if (highbd == 0) {
                  auVar57 = pmovzxbd(auVar55,auVar55);
                }
                else {
                  auVar57 = pmovzxwd(auVar55,auVar55);
                }
                piVar1 = (int *)(lVar39 + -0x7e98 + lVar43 * 4);
                piVar5 = (int *)(lVar39 + -0x7e94 + lVar43 * 4);
                piVar6 = (int *)(lVar39 + -0x7e90 + lVar43 * 4);
                auVar58._4_4_ = piVar1[1] * 5 + piVar5[1] * 6 + piVar6[1] * 5;
                auVar58._0_4_ = *piVar1 * 5 + *piVar5 * 6 + *piVar6 * 5;
                auVar58._8_4_ = piVar1[2] * 5 + piVar5[2] * 6 + piVar6[2] * 5;
                auVar58._12_4_ = piVar1[3] * 5 + piVar5[3] * 6 + piVar6[3] * 5;
                auVar94 = pmaddwd(auVar58,auVar57);
                piVar5 = (int *)(lVar39 + -8 + lVar43 * 4);
                iVar65 = piVar5[1];
                iVar75 = piVar5[2];
                iVar73 = piVar5[3];
                piVar6 = (int *)(lVar39 + -4 + lVar43 * 4);
                iVar87 = piVar6[1];
                iVar16 = piVar6[2];
                iVar18 = piVar6[3];
                piVar1 = (int *)(lVar39 + lVar43 * 4);
                iVar19 = piVar1[1];
                iVar20 = piVar1[2];
                iVar59 = piVar1[3];
                piVar2 = local_98 + lVar43;
                *piVar2 = *piVar5 * 5 + *piVar6 * 6 + *piVar1 * 5 + auVar94._0_4_ + auVar91._0_4_ >>
                          8;
                piVar2[1] = iVar65 * 5 + iVar87 * 6 + iVar19 * 5 + auVar94._4_4_ + auVar91._4_4_ >>
                            8;
                piVar2[2] = iVar75 * 5 + iVar16 * 6 + iVar20 * 5 + auVar94._8_4_ + auVar91._8_4_ >>
                            8;
                piVar2[3] = iVar73 * 5 + iVar18 * 6 + iVar59 * 5 + auVar94._12_4_ + auVar91._12_4_
                            >> 8;
                lVar43 = lVar43 + 4;
              } while (lVar43 < lVar44);
            }
            uVar37 = uVar37 + 1;
            local_98 = local_98 + flt_stride;
            iVar68 = iVar68 + dgd_stride;
            lVar39 = lVar39 + lVar34;
            lVar42 = lVar42 + lVar34;
            lVar35 = lVar35 + lVar34;
          } while (uVar37 != (uint)height);
        }
      }
    }
    uVar14 = av1_sgr_params[lVar41].r[1];
    if (0 < (int)uVar14) {
      iVar65 = uVar14 * 2 + 1;
      iVar65 = iVar65 * iVar65;
      iVar68 = av1_sgr_params[lVar41].s[1];
      uVar15 = av1_one_by_x[iVar65 - 1];
      uVar37 = 0x20;
      pauVar38 = (undefined1 (*) [16])local_78;
      do {
        auVar48._8_4_ = 0xffffffff;
        auVar48._0_8_ = 0xffffffffffffffff;
        auVar48._12_4_ = 0xffffffff;
        auVar49._0_8_ = 0xffffffffffffffff >> (uVar37 & 0xffffffff);
        auVar49._8_8_ = auVar48._8_8_ >> (uVar37 & 0xffffffff);
        auVar61 = pmovsxbd(ZEXT416((uint)uVar37),auVar49);
        *pauVar38 = auVar61;
        pauVar38 = pauVar38 + 1;
        uVar37 = uVar37 - 8;
      } while (uVar37 != 0);
      if (-2 < height) {
        auVar50._4_4_ = iVar68;
        auVar50._0_4_ = iVar68;
        auVar50._8_4_ = iVar68;
        auVar50._12_4_ = iVar68;
        lVar39 = (long)(int)((uVar14 + 1) * iVar30);
        auVar56._4_4_ = iVar65;
        auVar56._0_4_ = iVar65;
        auVar56._8_4_ = iVar65;
        auVar56._12_4_ = iVar65;
        uVar3 = bit_depth * 2 - 0x10;
        uVar45 = 1 << ((byte)uVar3 & 0x1f);
        iVar68 = (1 << ((byte)(bit_depth - 8U) & 0x1f)) >> 1;
        auVar69._4_4_ = uVar15;
        auVar69._0_4_ = uVar15;
        auVar69._8_4_ = uVar15;
        auVar69._12_4_ = uVar15;
        lVar42 = (long)(iVar30 * 3);
        pvVar33 = (void *)((long)__s_00 + lVar42 * 4);
        lVar34 = lVar31 * 4;
        lVar41 = lVar42 * 4 + (long)(int)(uVar14 * iVar30) * 4;
        lVar35 = (long)__s_00 + lVar41 + (ulong)uVar14 * 4 + 0xfd38;
        lVar43 = (long)__s_00 + (ulong)uVar14 * 4 + lVar42 * 4 + lVar39 * -4 + 0xfd38;
        lVar41 = (long)__s_00 + lVar41 + (long)(int)~uVar14 * 4 + 0xfd38;
        lVar39 = (long)__s_00 + lVar42 * 4 + (long)(int)~uVar14 * 4 + lVar39 * -4 + 0xfd38;
        uVar37 = 0xffffffffffffffff;
        auVar91 = pmovsxbw(in_XMM8,0x800080008000800);
        auVar57 = pmovzxbd(in_XMM9,0xffffffff);
        auVar61 = pmovsxwd(ZEXT416(uVar15),0x100010001000100);
        auVar70 = pmovsxwd(in_XMM10,0x800080008000800);
        do {
          if (-2 < width) {
            lVar46 = -1;
            iVar30 = width + 2;
            do {
              piVar1 = (int *)(lVar39 + 0x7e94 + lVar46 * 4);
              piVar5 = (int *)(lVar43 + 0x7e94 + lVar46 * 4);
              piVar6 = (int *)(lVar41 + 0x7e94 + lVar46 * 4);
              piVar7 = (int *)(lVar35 + 0x7e94 + lVar46 * 4);
              auVar72._0_4_ = *piVar7 + (*piVar1 - (*piVar6 + *piVar5));
              auVar72._4_4_ = piVar7[1] + (piVar1[1] - (piVar6[1] + piVar5[1]));
              auVar72._8_4_ = piVar7[2] + (piVar1[2] - (piVar6[2] + piVar5[2]));
              auVar72._12_4_ = piVar7[3] + (piVar1[3] - (piVar6[3] + piVar5[3]));
              piVar1 = (int *)(lVar39 + 4 + lVar46 * 4);
              piVar5 = (int *)(lVar43 + 4 + lVar46 * 4);
              piVar6 = (int *)(lVar41 + 4 + lVar46 * 4);
              piVar7 = (int *)(lVar35 + 4 + lVar46 * 4);
              auVar80._0_4_ = *piVar7 + (*piVar1 - (*piVar6 + *piVar5));
              auVar80._4_4_ = piVar7[1] + (piVar1[1] - (piVar6[1] + piVar5[1]));
              auVar80._8_4_ = piVar7[2] + (piVar1[2] - (piVar6[2] + piVar5[2]));
              auVar80._12_4_ = piVar7[3] + (piVar1[3] - (piVar6[3] + piVar5[3]));
              if (iVar30 < 4) {
                auVar72 = auVar72 & *(undefined1 (*) [16])(local_78 + (long)iVar30 * 0x10);
                auVar80 = auVar80 & *(undefined1 (*) [16])(local_78 + (long)iVar30 * 0x10);
              }
              if (bit_depth < 9) {
                auVar94 = pmaddwd(auVar72,auVar72);
                auVar83 = pmulld(auVar80,auVar56);
              }
              else {
                uVar62 = (ulong)uVar3;
                auVar81._0_4_ = auVar80._0_4_ + (uVar45 >> 1) >> uVar62;
                auVar81._4_4_ = auVar80._4_4_ + (uVar45 >> 1) >> uVar62;
                auVar81._8_4_ = auVar80._8_4_ + (uVar45 >> 1) >> uVar62;
                auVar81._12_4_ = auVar80._12_4_ + (uVar45 >> 1) >> uVar62;
                uVar62 = (ulong)(bit_depth - 8U);
                auVar93._0_4_ = (uint)(auVar72._0_4_ + iVar68) >> uVar62;
                auVar93._4_4_ = (uint)(auVar72._4_4_ + iVar68) >> uVar62;
                auVar93._8_4_ = (uint)(auVar72._8_4_ + iVar68) >> uVar62;
                auVar93._12_4_ = (uint)(auVar72._12_4_ + iVar68) >> uVar62;
                auVar94 = pmaddwd(auVar93,auVar93);
                auVar82 = pmulld(auVar81,auVar56);
                iVar65 = auVar94._0_4_;
                iVar75 = auVar82._0_4_;
                auVar83._0_4_ = (uint)(iVar75 < iVar65) * iVar65 | (uint)(iVar75 >= iVar65) * iVar75
                ;
                iVar65 = auVar94._4_4_;
                iVar75 = auVar82._4_4_;
                auVar83._4_4_ = (uint)(iVar75 < iVar65) * iVar65 | (uint)(iVar75 >= iVar65) * iVar75
                ;
                iVar65 = auVar94._8_4_;
                iVar75 = auVar82._8_4_;
                iVar73 = auVar82._12_4_;
                auVar83._8_4_ = (uint)(iVar75 < iVar65) * iVar65 | (uint)(iVar75 >= iVar65) * iVar75
                ;
                iVar65 = auVar94._12_4_;
                auVar83._12_4_ =
                     (uint)(iVar73 < iVar65) * iVar65 | (uint)(iVar73 >= iVar65) * iVar73;
              }
              auVar84._0_4_ = auVar83._0_4_ - auVar94._0_4_;
              auVar84._4_4_ = auVar83._4_4_ - auVar94._4_4_;
              auVar84._8_4_ = auVar83._8_4_ - auVar94._8_4_;
              auVar84._12_4_ = auVar83._12_4_ - auVar94._12_4_;
              auVar94 = pmulld(auVar84,auVar50);
              uVar85 = (uint)(auVar94._0_4_ + auVar91._0_4_) >> 0x14;
              uVar86 = (uint)(auVar94._4_4_ + auVar91._4_4_) >> 0x14;
              uVar88 = (uint)(auVar94._8_4_ + auVar91._8_4_) >> 0x14;
              uVar89 = (uint)(auVar94._12_4_ + auVar91._12_4_) >> 0x14;
              uVar14 = auVar57._0_4_;
              uVar15 = auVar57._4_4_;
              uVar17 = auVar57._8_4_;
              uVar74 = auVar57._12_4_;
              iVar65 = av1_x_by_xplus1[(uVar14 < uVar85) * uVar14 | (uVar14 >= uVar85) * uVar85];
              iVar75 = av1_x_by_xplus1[(uVar15 < uVar86) * uVar15 | (uVar15 >= uVar86) * uVar86];
              iVar73 = av1_x_by_xplus1[(uVar17 < uVar88) * uVar17 | (uVar17 >= uVar88) * uVar88];
              iVar87 = av1_x_by_xplus1[(uVar74 < uVar89) * uVar74 | (uVar74 >= uVar89) * uVar89];
              puVar4 = (undefined8 *)((long)pvVar33 + lVar46 * 4 + 0x1c);
              *puVar4 = CONCAT44(iVar75,iVar65);
              puVar4[1] = CONCAT44(iVar87,iVar73);
              auVar95._0_4_ = auVar61._0_4_ - iVar65;
              auVar95._4_4_ = auVar61._4_4_ - iVar75;
              auVar95._8_4_ = auVar61._8_4_ - iVar73;
              auVar95._12_4_ = auVar61._12_4_ - iVar87;
              auVar94 = pmaddwd(auVar95,auVar69);
              auVar94 = pmulld(auVar94,auVar72);
              puVar8 = (uint *)((long)pvVar33 + lVar46 * 4 + 0x7eac);
              *puVar8 = (uint)(auVar94._0_4_ + auVar70._0_4_) >> 0xc;
              puVar8[1] = (uint)(auVar94._4_4_ + auVar70._4_4_) >> 0xc;
              puVar8[2] = (uint)(auVar94._8_4_ + auVar70._8_4_) >> 0xc;
              puVar8[3] = (uint)(auVar94._12_4_ + auVar70._12_4_) >> 0xc;
              lVar46 = lVar46 + 4;
              iVar30 = iVar30 + -4;
            } while (lVar46 <= lVar44);
          }
          uVar37 = uVar37 + 1;
          pvVar33 = (void *)((long)pvVar33 + lVar34);
          lVar35 = lVar35 + lVar34;
          lVar43 = lVar43 + lVar34;
          lVar41 = lVar41 + lVar34;
          lVar39 = lVar39 + lVar34;
        } while (uVar37 != height + 1);
        puVar40 = (uint8_t *)((long)dgd8 * 2);
        if (highbd == 0) {
          puVar40 = dgd8;
        }
        if (0 < height) {
          lVar41 = (long)__s_00 + lVar31 * 8 + lVar42 * 4 + 0x7eb0;
          lVar31 = (long)__s_00 + lVar31 * 4 + lVar42 * 4 + 0x7eb0;
          lVar35 = (long)__s_00 + lVar42 * 4 + 0x7eb0;
          iVar30 = 0;
          uVar37 = 0;
          local_80 = flt1;
          do {
            if (0 < width) {
              lVar39 = 0;
              do {
                auVar51._8_8_ = 0;
                auVar51._0_8_ = *(ulong *)(puVar40 + (iVar30 + (int)lVar39 << (bVar32 & 0x1f)));
                if (highbd == 0) {
                  auVar91 = pmovzxbd(auVar56,auVar51);
                }
                else {
                  auVar91 = pmovzxwd(auVar56,auVar51);
                }
                piVar1 = (int *)(lVar35 + -0x7e98 + lVar39 * 4);
                piVar5 = (int *)(lVar35 + -0x7e94 + lVar39 * 4);
                piVar6 = (int *)(lVar35 + -0x7e90 + lVar39 * 4);
                piVar7 = (int *)(lVar31 + -0x7e98 + lVar39 * 4);
                piVar9 = (int *)(lVar31 + -0x7e94 + lVar39 * 4);
                piVar10 = (int *)(lVar31 + -0x7e90 + lVar39 * 4);
                piVar11 = (int *)(lVar41 + -0x7e98 + lVar39 * 4);
                piVar12 = (int *)(lVar41 + -0x7e94 + lVar39 * 4);
                piVar13 = (int *)(lVar41 + -0x7e90 + lVar39 * 4);
                auVar52._0_4_ =
                     (*piVar12 + *piVar10 + *piVar9 + *piVar7 + *piVar5) * 4 +
                     (*piVar13 + *piVar11 + *piVar6 + *piVar1) * 3;
                auVar52._4_4_ =
                     (piVar12[1] + piVar10[1] + piVar9[1] + piVar7[1] + piVar5[1]) * 4 +
                     (piVar13[1] + piVar11[1] + piVar6[1] + piVar1[1]) * 3;
                auVar52._8_4_ =
                     (piVar12[2] + piVar10[2] + piVar9[2] + piVar7[2] + piVar5[2]) * 4 +
                     (piVar13[2] + piVar11[2] + piVar6[2] + piVar1[2]) * 3;
                auVar52._12_4_ =
                     (piVar12[3] + piVar10[3] + piVar9[3] + piVar7[3] + piVar5[3]) * 4 +
                     (piVar13[3] + piVar11[3] + piVar6[3] + piVar1[3]) * 3;
                auVar91 = pmaddwd(auVar52,auVar91);
                piVar7 = (int *)(lVar35 + -8 + lVar39 * 4);
                iVar68 = piVar7[1];
                iVar65 = piVar7[2];
                iVar75 = piVar7[3];
                piVar9 = (int *)(lVar35 + -4 + lVar39 * 4);
                iVar73 = piVar9[1];
                iVar87 = piVar9[2];
                iVar16 = piVar9[3];
                piVar1 = (int *)(lVar35 + lVar39 * 4);
                iVar18 = piVar1[1];
                iVar19 = piVar1[2];
                iVar20 = piVar1[3];
                piVar10 = (int *)(lVar31 + -8 + lVar39 * 4);
                iVar59 = piVar10[1];
                iVar60 = piVar10[2];
                iVar63 = piVar10[3];
                piVar11 = (int *)(lVar31 + -4 + lVar39 * 4);
                iVar64 = piVar11[1];
                iVar66 = piVar11[2];
                iVar67 = piVar11[3];
                piVar5 = (int *)(lVar31 + lVar39 * 4);
                iVar21 = piVar5[1];
                iVar22 = piVar5[2];
                iVar23 = piVar5[3];
                auVar56 = *(undefined1 (*) [16])(lVar41 + -8 + lVar39 * 4);
                piVar12 = (int *)(lVar41 + -4 + lVar39 * 4);
                iVar24 = piVar12[1];
                iVar25 = piVar12[2];
                iVar26 = piVar12[3];
                piVar6 = (int *)(lVar41 + lVar39 * 4);
                iVar27 = piVar6[1];
                iVar28 = piVar6[2];
                iVar29 = piVar6[3];
                piVar2 = local_80 + lVar39;
                *piVar2 = auVar91._0_4_ + (*piVar6 + auVar56._0_4_ + *piVar1 + *piVar7) * 3 +
                          (*piVar12 + *piVar5 + *piVar11 + *piVar10 + *piVar9) * 4 + auVar61._0_4_
                          >> 9;
                piVar2[1] = auVar91._4_4_ + (iVar27 + auVar56._4_4_ + iVar18 + iVar68) * 3 +
                            (iVar24 + iVar21 + iVar64 + iVar59 + iVar73) * 4 + auVar61._4_4_ >> 9;
                piVar2[2] = auVar91._8_4_ + (iVar28 + auVar56._8_4_ + iVar19 + iVar65) * 3 +
                            (iVar25 + iVar22 + iVar66 + iVar60 + iVar87) * 4 + auVar61._8_4_ >> 9;
                piVar2[3] = auVar91._12_4_ + (iVar29 + auVar56._12_4_ + iVar20 + iVar75) * 3 +
                            (iVar26 + iVar23 + iVar67 + iVar63 + iVar16) * 4 + auVar61._12_4_ >> 9;
                lVar39 = lVar39 + 4;
              } while (lVar39 < lVar44);
            }
            uVar37 = uVar37 + 1;
            local_80 = local_80 + flt_stride;
            iVar30 = iVar30 + dgd_stride;
            lVar41 = lVar41 + lVar34;
            lVar31 = lVar31 + lVar34;
            lVar35 = lVar35 + lVar34;
          } while (uVar37 != (uint)height);
        }
      }
    }
    aom_free(__s_00);
    iVar30 = 0;
  }
  return iVar30;
}

Assistant:

int av1_selfguided_restoration_sse4_1(const uint8_t *dgd8, int width,
                                      int height, int dgd_stride, int32_t *flt0,
                                      int32_t *flt1, int flt_stride,
                                      int sgr_params_idx, int bit_depth,
                                      int highbd) {
  int32_t *buf = (int32_t *)aom_memalign(
      16, 4 * sizeof(*buf) * RESTORATION_PROC_UNIT_PELS);
  if (!buf) return -1;
  memset(buf, 0, 4 * sizeof(*buf) * RESTORATION_PROC_UNIT_PELS);

  const int width_ext = width + 2 * SGRPROJ_BORDER_HORZ;
  const int height_ext = height + 2 * SGRPROJ_BORDER_VERT;

  // Adjusting the stride of A and B here appears to avoid bad cache effects,
  // leading to a significant speed improvement.
  // We also align the stride to a multiple of 16 bytes for efficiency.
  int buf_stride = ((width_ext + 3) & ~3) + 16;

  // The "tl" pointers point at the top-left of the initialised data for the
  // array. Adding 3 here ensures that column 1 is 16-byte aligned.
  int32_t *Atl = buf + 0 * RESTORATION_PROC_UNIT_PELS + 3;
  int32_t *Btl = buf + 1 * RESTORATION_PROC_UNIT_PELS + 3;
  int32_t *Ctl = buf + 2 * RESTORATION_PROC_UNIT_PELS + 3;
  int32_t *Dtl = buf + 3 * RESTORATION_PROC_UNIT_PELS + 3;

  // The "0" pointers are (- SGRPROJ_BORDER_VERT, -SGRPROJ_BORDER_HORZ). Note
  // there's a zero row and column in A, B (integral images), so we move down
  // and right one for them.
  const int buf_diag_border =
      SGRPROJ_BORDER_HORZ + buf_stride * SGRPROJ_BORDER_VERT;

  int32_t *A0 = Atl + 1 + buf_stride;
  int32_t *B0 = Btl + 1 + buf_stride;
  int32_t *C0 = Ctl + 1 + buf_stride;
  int32_t *D0 = Dtl + 1 + buf_stride;

  // Finally, A, B, C, D point at position (0, 0).
  int32_t *A = A0 + buf_diag_border;
  int32_t *B = B0 + buf_diag_border;
  int32_t *C = C0 + buf_diag_border;
  int32_t *D = D0 + buf_diag_border;

  const int dgd_diag_border =
      SGRPROJ_BORDER_HORZ + dgd_stride * SGRPROJ_BORDER_VERT;
  const uint8_t *dgd0 = dgd8 - dgd_diag_border;

  // Generate integral images from the input. C will contain sums of squares; D
  // will contain just sums
  if (highbd)
    integral_images_highbd(CONVERT_TO_SHORTPTR(dgd0), dgd_stride, width_ext,
                           height_ext, Ctl, Dtl, buf_stride);
  else
    integral_images(dgd0, dgd_stride, width_ext, height_ext, Ctl, Dtl,
                    buf_stride);

  const sgr_params_type *const params = &av1_sgr_params[sgr_params_idx];
  // Write to flt0 and flt1
  // If params->r == 0 we skip the corresponding filter. We only allow one of
  // the radii to be 0, as having both equal to 0 would be equivalent to
  // skipping SGR entirely.
  assert(!(params->r[0] == 0 && params->r[1] == 0));
  assert(params->r[0] < AOMMIN(SGRPROJ_BORDER_VERT, SGRPROJ_BORDER_HORZ));
  assert(params->r[1] < AOMMIN(SGRPROJ_BORDER_VERT, SGRPROJ_BORDER_HORZ));

  if (params->r[0] > 0) {
    calc_ab_fast(A, B, C, D, width, height, buf_stride, bit_depth,
                 sgr_params_idx, 0);
    final_filter_fast(flt0, flt_stride, A, B, buf_stride, dgd8, dgd_stride,
                      width, height, highbd);
  }

  if (params->r[1] > 0) {
    calc_ab(A, B, C, D, width, height, buf_stride, bit_depth, sgr_params_idx,
            1);
    final_filter(flt1, flt_stride, A, B, buf_stride, dgd8, dgd_stride, width,
                 height, highbd);
  }
  aom_free(buf);
  return 0;
}